

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O0

int __thiscall soplex::NameSet::remove(NameSet *this,char *__filename)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  Name local_18;
  char *local_10;
  NameSet *local_8;
  
  pcVar1 = this->mem;
  local_10 = __filename;
  local_8 = this;
  piVar3 = DataSet<int>::operator[](&this->set,(DataKey *)__filename);
  Name::Name(&local_18,pcVar1 + *piVar3);
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::remove(&this->hashtab,(char *)&local_18);
  iVar2 = DataSet<int>::remove(&this->set,local_10);
  return iVar2;
}

Assistant:

void NameSet::remove(const DataKey& p_key)
{
   assert(has(p_key));

   hashtab.remove(Name(&mem[set[p_key]]));
   set.remove(p_key);
}